

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf.c
# Opt level: O2

void sysbvm_dwarf_cfi_setPC(sysbvm_dwarf_cfi_builder_t *cfi,size_t pc)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  ulong uVar3;
  
  uVar3 = pc - cfi->currentPC;
  if (uVar3 != 0) {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = (cfi->cie).codeAlignmentFactor;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar3;
    auVar2 = auVar2 / auVar1;
    uVar3 = auVar2._0_8_;
    if (uVar3 < 0x40) {
      uVar3 = (ulong)(byte)(auVar2[0] | 0x40);
    }
    else {
      if (0xff < uVar3) {
        if (uVar3 < 0x10000) {
          sysbvm_dwarf_encodeByte(&cfi->buffer,'\x03');
          sysbvm_dwarf_encodeWord(&cfi->buffer,auVar2._0_2_);
        }
        else {
          if (uVar3 >> 0x20 != 0) {
            sysbvm_error_assertionFailure
                      (
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/lib/sysbvm/dwarf.c:243: assertion failure: advanceFactor <= 0xFFFFFFFF"
                      );
          }
          sysbvm_dwarf_encodeByte(&cfi->buffer,'\x04');
          sysbvm_dwarf_encodeDWord(&cfi->buffer,auVar2._0_4_);
        }
        goto LAB_0014e3f9;
      }
      sysbvm_dwarf_encodeByte(&cfi->buffer,'\x02');
    }
    sysbvm_dwarf_encodeByte(&cfi->buffer,(uint8_t)uVar3);
  }
LAB_0014e3f9:
  cfi->currentPC = pc;
  return;
}

Assistant:

SYSBVM_API void sysbvm_dwarf_cfi_setPC(sysbvm_dwarf_cfi_builder_t *cfi, size_t pc)
{
    size_t advance = pc - cfi->currentPC;
    if(advance)
    {
        size_t advanceFactor = advance / cfi->cie.codeAlignmentFactor;
        if(advanceFactor <= 63)
        {
            sysbvm_dwarf_encodeByte(&cfi->buffer, (DW_OP_CFA_advance_loc << 6) | (uint8_t)advanceFactor);
        }
        else
        {
            if(advanceFactor <= 0xFF)
            {
                sysbvm_dwarf_encodeByte(&cfi->buffer, DW_OP_CFA_advance_loc1);
                sysbvm_dwarf_encodeByte(&cfi->buffer, (uint8_t)advanceFactor);
            }
            else if(advanceFactor <= 0xFFFF)
            {
                sysbvm_dwarf_encodeByte(&cfi->buffer, DW_OP_CFA_advance_loc2);
                sysbvm_dwarf_encodeWord(&cfi->buffer, (uint16_t)advanceFactor);
            }
            else
            {
                SYSBVM_ASSERT(advanceFactor <= 0xFFFFFFFF);
                sysbvm_dwarf_encodeByte(&cfi->buffer, DW_OP_CFA_advance_loc4);
                sysbvm_dwarf_encodeDWord(&cfi->buffer, (uint32_t)advanceFactor);
            }
        }
    }

    cfi->currentPC = pc;
}